

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeProfileDef::~IfcCompositeProfileDef
          (IfcCompositeProfileDef *this)

{
  _func_int *p_Var1;
  char *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcProfileDef).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcProfileDef).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  pcVar2 = (this->Label).ptr.field_2._M_local_buf + (long)p_Var3;
  pcVar2[-0x90] = 'x';
  pcVar2[-0x8f] = 'R';
  pcVar2[-0x8e] = -0x73;
  pcVar2[-0x8d] = '\0';
  pcVar2[-0x8c] = '\0';
  pcVar2[-0x8b] = '\0';
  pcVar2[-0x8a] = '\0';
  pcVar2[-0x89] = '\0';
  pcVar2[0x18] = -0x38;
  pcVar2[0x19] = 'R';
  pcVar2[0x1a] = -0x73;
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[-0x38] = -0x60;
  pcVar2[-0x37] = 'R';
  pcVar2[-0x36] = -0x73;
  pcVar2[-0x35] = '\0';
  pcVar2[-0x34] = '\0';
  pcVar2[-0x33] = '\0';
  pcVar2[-0x32] = '\0';
  pcVar2[-0x31] = '\0';
  if (*(char **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(char **)(pcVar2 + -0x10));
  }
  if (*(void **)(p_Var1 + 0x68) != (void *)0x0) {
    operator_delete(*(void **)(p_Var1 + 0x68));
  }
  *(undefined8 *)p_Var1 = 0x8d52f0;
  *(undefined8 *)(p_Var1 + 0xa8) = 0x8d5318;
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30));
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcCompositeProfileDef() : Object("IfcCompositeProfileDef") {}